

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_expression(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_60 [8];
  string symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<expression>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = Tokenizer::op_exists(this->tokenizer,&this->cur_token);
  if (!bVar1) {
    expression_writer(this,&this->cur_token);
  }
  parse_term(this);
  while( true ) {
    bVar1 = Tokenizer::op_exists(this->tokenizer,&this->cur_token);
    if (!bVar1) break;
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_30,"\t\t\t\t\t<symbol>",&this->cur_token);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    poVar2 = std::operator<<(poVar2,"</symbol>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string((string *)local_60,(string *)&this->cur_token);
    query_tokenizer(this);
    expression_writer(this,&this->cur_token);
    parse_term(this);
    expression_writer(this,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
  }
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t</expression>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Parser::parse_expression() {
    out_file << "\t\t\t\t<expression>" << std::endl;
    if (!tokenizer.op_exists(cur_token)) {
        expression_writer(cur_token);
    }
    parse_term();

    while (tokenizer.op_exists(cur_token)) {
        out_file << "\t\t\t\t\t<symbol>" + cur_token << "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        expression_writer(cur_token);
        parse_term();
        expression_writer(symbol);
    }

    out_file << "\t\t\t\t</expression>" << std::endl;
}